

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_storage_json.cpp
# Opt level: O2

Status __thiscall
ot::commissioner::persistent_storage::PersistentStorageJson::Del
          (PersistentStorageJson *this,RegistrarId *aId)

{
  Status SVar1;
  string sStack_38;
  
  std::__cxx11::string::string((string *)&sStack_38,(string *)JSON_DOM_abi_cxx11_);
  SVar1 = DelId<ot::commissioner::persistent_storage::Domain,ot::commissioner::persistent_storage::DomainId>
                    (this,aId,&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  return SVar1;
}

Assistant:

PersistentStorage::Status PersistentStorageJson::Del(DomainId const &aId)
{
    return DelId<Domain, DomainId>(aId, JSON_DOM);
}